

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  BreakpointSource BVar32;
  int32_t iVar33;
  fpclass_type fVar34;
  int32_t iVar35;
  int iVar36;
  BreakpointSource BVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  int *piVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  uint uVar46;
  type t;
  cpp_dec_float<100U,_int,_void> local_548;
  Breakpoint local_4f8;
  Breakpoint local_498;
  Breakpoint local_438;
  Breakpoint local_3d8;
  Breakpoint local_378;
  Breakpoint local_318;
  Breakpoint local_2b8;
  Breakpoint local_258;
  Breakpoint local_1f8;
  Breakpoint local_198;
  Breakpoint local_138;
  Breakpoint local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if (start + 1 < end) {
    uVar43 = end - 1;
    uVar38 = uVar43 - start;
    if (0x18 < (int)uVar38) {
LAB_00498c53:
      iVar39 = (uVar38 >> 1) + start;
      pBVar1 = keys + iVar39;
      uVar8 = *(undefined8 *)keys[iVar39].val.m_backend.data._M_elems;
      uVar9 = *(undefined8 *)(keys[iVar39].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar39].val.m_backend.data._M_elems + 4;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar39].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar39].val.m_backend.data._M_elems + 0xc;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      iVar5 = keys[iVar39].val.m_backend.exp;
      bVar3 = keys[iVar39].val.m_backend.neg;
      fVar6 = keys[iVar39].val.m_backend.fpclass;
      iVar7 = keys[iVar39].val.m_backend.prec_elem;
      uVar31._0_4_ = keys[iVar39].idx;
      uVar31._4_4_ = keys[iVar39].src;
      lVar40 = (long)start;
      uVar38 = uVar43;
      uVar46 = start;
      do {
        uVar42 = (ulong)uVar38;
        if ((type & 1U) == 0) {
          if ((int)uVar46 < (int)uVar43) {
            piVar41 = &keys[(int)uVar46].idx;
            do {
              local_198.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
              local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
              local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
              local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
              local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
              local_198.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
              local_198.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
              local_198.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
              local_198.val.m_backend.exp = piVar41[-4];
              local_198.val.m_backend.neg = *(bool *)(piVar41 + -3);
              local_198.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
              local_198._80_8_ = *(undefined8 *)piVar41;
              local_3d8.val.m_backend.data._M_elems._0_8_ = uVar8;
              local_3d8.val.m_backend.data._M_elems._8_8_ = uVar9;
              local_3d8.val.m_backend.data._M_elems._16_8_ = uVar10;
              local_3d8.val.m_backend.data._M_elems._24_8_ = uVar11;
              local_3d8.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_3d8.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_3d8.val.m_backend.data._M_elems._48_8_ = uVar14;
              local_3d8.val.m_backend.data._M_elems._56_8_ = uVar15;
              local_3d8.val.m_backend.exp = iVar5;
              local_3d8.val.m_backend.neg = bVar3;
              local_3d8.val.m_backend.fpclass = fVar6;
              local_3d8.val.m_backend.prec_elem = iVar7;
              local_3d8._80_8_ = uVar31;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_198,&local_3d8);
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (0 < iVar39) break;
              uVar46 = uVar46 + 1;
              piVar41 = piVar41 + 0x16;
            } while (uVar43 != uVar46);
          }
          if (start < (int)uVar38) {
            uVar42 = (ulong)(int)uVar38;
            piVar41 = &keys[uVar42].idx;
            do {
              local_1f8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
              local_1f8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
              local_1f8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
              local_1f8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
              local_1f8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
              local_1f8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
              local_1f8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
              local_1f8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
              local_1f8.val.m_backend.exp = piVar41[-4];
              local_1f8.val.m_backend.neg = *(bool *)(piVar41 + -3);
              local_1f8.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
              local_1f8._80_8_ = *(undefined8 *)piVar41;
              local_438.val.m_backend.data._M_elems._0_8_ = uVar8;
              local_438.val.m_backend.data._M_elems._8_8_ = uVar9;
              local_438.val.m_backend.data._M_elems._16_8_ = uVar10;
              local_438.val.m_backend.data._M_elems._24_8_ = uVar11;
              local_438.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_438.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_438.val.m_backend.data._M_elems._48_8_ = uVar14;
              local_438.val.m_backend.data._M_elems._56_8_ = uVar15;
              local_438.val.m_backend.exp = iVar5;
              local_438.val.m_backend.neg = bVar3;
              local_438.val.m_backend.fpclass = fVar6;
              local_438.val.m_backend.prec_elem = iVar7;
              local_438._80_8_ = uVar31;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_1f8,&local_438);
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (iVar39 < 1) break;
              uVar42 = uVar42 - 1;
              piVar41 = piVar41 + -0x16;
            } while (lVar40 < (long)uVar42);
          }
        }
        else {
          if ((int)uVar46 < (int)uVar43) {
            piVar41 = &keys[(int)uVar46].idx;
            lVar45 = 0;
            do {
              local_d8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
              local_d8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
              local_d8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
              local_d8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
              local_d8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
              local_d8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
              local_d8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
              local_d8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
              local_d8.val.m_backend.exp = piVar41[-4];
              local_d8.val.m_backend.neg = *(bool *)(piVar41 + -3);
              local_d8.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
              local_d8._80_8_ = *(undefined8 *)piVar41;
              local_318.val.m_backend.data._M_elems._0_8_ = uVar8;
              local_318.val.m_backend.data._M_elems._8_8_ = uVar9;
              local_318.val.m_backend.data._M_elems._16_8_ = uVar10;
              local_318.val.m_backend.data._M_elems._24_8_ = uVar11;
              local_318.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_318.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_318.val.m_backend.data._M_elems._48_8_ = uVar14;
              local_318.val.m_backend.data._M_elems._56_8_ = uVar15;
              local_318.val.m_backend.exp = iVar5;
              local_318.val.m_backend.neg = bVar3;
              local_318.val.m_backend.fpclass = fVar6;
              local_318.val.m_backend.prec_elem = iVar7;
              local_318._80_8_ = uVar31;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_d8,&local_318);
              if (local_548.fpclass == cpp_dec_float_NaN) {
                uVar46 = uVar46 - (int)lVar45;
                goto LAB_00499033;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (-1 < iVar39) {
                uVar46 = uVar46 - (int)lVar45;
                goto LAB_00499033;
              }
              lVar45 = lVar45 + -1;
              piVar41 = piVar41 + 0x16;
            } while ((long)(int)uVar46 - (long)(int)uVar43 != lVar45);
            uVar46 = uVar46 - (int)lVar45;
          }
LAB_00499033:
          if (start < (int)uVar38) {
            uVar42 = (ulong)(int)uVar38;
            piVar41 = &keys[uVar42].idx;
            do {
              local_138.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
              local_138.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
              local_138.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
              local_138.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
              local_138.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
              local_138.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
              local_138.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
              local_138.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
              local_138.val.m_backend.exp = piVar41[-4];
              local_138.val.m_backend.neg = *(bool *)(piVar41 + -3);
              local_138.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
              local_138._80_8_ = *(undefined8 *)piVar41;
              local_378.val.m_backend.data._M_elems._0_8_ = uVar8;
              local_378.val.m_backend.data._M_elems._8_8_ = uVar9;
              local_378.val.m_backend.data._M_elems._16_8_ = uVar10;
              local_378.val.m_backend.data._M_elems._24_8_ = uVar11;
              local_378.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_378.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_378.val.m_backend.data._M_elems._48_8_ = uVar14;
              local_378.val.m_backend.data._M_elems._56_8_ = uVar15;
              local_378.val.m_backend.exp = iVar5;
              local_378.val.m_backend.neg = bVar3;
              local_378.val.m_backend.fpclass = fVar6;
              local_378.val.m_backend.prec_elem = iVar7;
              local_378._80_8_ = uVar31;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_138,&local_378);
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (iVar39 < 0) break;
              uVar42 = uVar42 - 1;
              piVar41 = piVar41 + -0x16;
            } while (lVar40 < (long)uVar42);
          }
        }
        uVar38 = (uint)uVar42;
        if ((int)uVar38 <= (int)uVar46) goto LAB_00499420;
        uVar16 = *(undefined8 *)keys[(int)uVar46].val.m_backend.data._M_elems;
        uVar17 = *(undefined8 *)(keys[(int)uVar46].val.m_backend.data._M_elems + 2);
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 4;
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 8;
        uVar20 = *(undefined8 *)puVar2;
        uVar21 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 0xc;
        uVar22 = *(undefined8 *)puVar2;
        uVar23 = *(undefined8 *)(puVar2 + 2);
        iVar39 = keys[(int)uVar46].val.m_backend.exp;
        bVar4 = keys[(int)uVar46].val.m_backend.neg;
        iVar36 = keys[(int)uVar46].idx;
        BVar37 = keys[(int)uVar46].src;
        uVar24 = *(undefined8 *)(keys[(int)uVar38].val.m_backend.data._M_elems + 2);
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 4;
        uVar25 = *(undefined8 *)puVar2;
        uVar26 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 8;
        uVar27 = *(undefined8 *)puVar2;
        uVar28 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 0xc;
        uVar29 = *(undefined8 *)puVar2;
        uVar30 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[(int)uVar46].val.m_backend.data._M_elems =
             *(undefined8 *)keys[(int)uVar38].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[(int)uVar46].val.m_backend.data._M_elems + 2) = uVar24;
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar25;
        *(undefined8 *)(puVar2 + 2) = uVar26;
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar27;
        *(undefined8 *)(puVar2 + 2) = uVar28;
        puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar29;
        *(undefined8 *)(puVar2 + 2) = uVar30;
        keys[(int)uVar46].val.m_backend.exp = keys[(int)uVar38].val.m_backend.exp;
        keys[(int)uVar46].val.m_backend.neg = keys[(int)uVar38].val.m_backend.neg;
        BVar32 = keys[(int)uVar38].src;
        keys[(int)uVar46].idx = keys[(int)uVar38].idx;
        keys[(int)uVar46].src = BVar32;
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar22;
        *(undefined8 *)(puVar2 + 2) = uVar23;
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar20;
        *(undefined8 *)(puVar2 + 2) = uVar21;
        puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar18;
        *(undefined8 *)(puVar2 + 2) = uVar19;
        *(undefined8 *)keys[(int)uVar38].val.m_backend.data._M_elems = uVar16;
        *(undefined8 *)(keys[(int)uVar38].val.m_backend.data._M_elems + 2) = uVar17;
        keys[(int)uVar38].val.m_backend.exp = iVar39;
        keys[(int)uVar38].val.m_backend.neg = bVar4;
        fVar34 = keys[(int)uVar46].val.m_backend.fpclass;
        iVar35 = keys[(int)uVar46].val.m_backend.prec_elem;
        iVar33 = keys[(int)uVar38].val.m_backend.prec_elem;
        keys[(int)uVar46].val.m_backend.fpclass = keys[(int)uVar38].val.m_backend.fpclass;
        keys[(int)uVar46].val.m_backend.prec_elem = iVar33;
        keys[(int)uVar38].val.m_backend.fpclass = fVar34;
        keys[(int)uVar38].val.m_backend.prec_elem = iVar35;
        keys[(int)uVar38].idx = iVar36;
        keys[(int)uVar38].src = BVar37;
        uVar46 = uVar46 + 1;
        uVar38 = uVar38 - 1;
      } while( true );
    }
LAB_00499954:
    if (0 < (int)uVar38) {
      SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                (keys,uVar43,compare,start);
    }
  }
  return;
LAB_00499420:
  if ((type & 1U) == 0) {
    if (start < (int)uVar38) {
      uVar42 = (ulong)(int)uVar38;
      piVar41 = &keys[uVar42].idx;
      do {
        local_2b8.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
        local_2b8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
        local_2b8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
        local_2b8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
        local_2b8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
        local_2b8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
        local_2b8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
        local_2b8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
        local_2b8.val.m_backend.exp = piVar41[-4];
        local_2b8.val.m_backend.neg = *(bool *)(piVar41 + -3);
        local_2b8.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
        local_2b8._80_8_ = *(undefined8 *)piVar41;
        local_4f8.val.m_backend.data._M_elems._0_8_ = uVar8;
        local_4f8.val.m_backend.data._M_elems._8_8_ = uVar9;
        local_4f8.val.m_backend.data._M_elems._16_8_ = uVar10;
        local_4f8.val.m_backend.data._M_elems._24_8_ = uVar11;
        local_4f8.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_4f8.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_4f8.val.m_backend.data._M_elems._48_8_ = uVar14;
        local_4f8.val.m_backend.data._M_elems._56_8_ = uVar15;
        local_4f8.val.m_backend.exp = iVar5;
        local_4f8.val.m_backend.neg = bVar3;
        local_4f8.val.m_backend.fpclass = fVar6;
        local_4f8.val.m_backend.prec_elem = iVar7;
        local_4f8._80_8_ = uVar31;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_548,compare,&local_4f8,&local_2b8);
        if (local_548.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_80,0,(type *)0x0);
        iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_548,&local_80);
        if (0 < iVar39) break;
        uVar42 = uVar42 - 1;
        piVar41 = piVar41 + -0x16;
      } while (lVar40 < (long)uVar42);
    }
    uVar38 = (uint)uVar42;
    if (uVar38 == uVar43) {
      uVar31 = *(undefined8 *)keys[(int)uVar38].val.m_backend.data._M_elems;
      uVar8 = *(undefined8 *)(keys[(int)uVar38].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 4;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 8;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 0xc;
      uVar13 = *(undefined8 *)puVar2;
      uVar14 = *(undefined8 *)(puVar2 + 2);
      iVar5 = keys[(int)uVar38].val.m_backend.exp;
      bVar3 = keys[(int)uVar38].val.m_backend.neg;
      iVar39 = keys[(int)uVar38].idx;
      BVar37 = keys[(int)uVar38].src;
      uVar15 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2);
      uVar16 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4);
      uVar17 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6);
      uVar18 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8);
      uVar19 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10);
      uVar20 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc);
      uVar21 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar38].val.m_backend.data._M_elems =
           *(undefined8 *)(pBVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar38].val.m_backend.data._M_elems + 2) = uVar15;
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      puVar2 = keys[(int)uVar38].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      keys[(int)uVar38].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[(int)uVar38].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar32 = pBVar1->src;
      keys[(int)uVar38].idx = pBVar1->idx;
      keys[(int)uVar38].src = BVar32;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc) = uVar13;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10) = uVar12;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4) = uVar9;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6) = uVar10;
      *(undefined8 *)(pBVar1->val).m_backend.data._M_elems = uVar31;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2) = uVar8;
      (pBVar1->val).m_backend.exp = iVar5;
      (pBVar1->val).m_backend.neg = bVar3;
      fVar6 = keys[(int)uVar38].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar38].val.m_backend.prec_elem;
      iVar7 = (pBVar1->val).m_backend.prec_elem;
      keys[(int)uVar38].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[(int)uVar38].val.m_backend.prec_elem = iVar7;
      (pBVar1->val).m_backend.fpclass = fVar6;
      (pBVar1->val).m_backend.prec_elem = iVar33;
      pBVar1->idx = iVar39;
      pBVar1->src = BVar37;
      uVar38 = uVar38 - 1;
    }
  }
  else {
    if ((int)uVar46 < (int)uVar43) {
      piVar41 = &keys[(int)uVar46].idx;
      do {
        local_258.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((Breakpoint *)(piVar41 + -0x14))->val).m_backend.data._M_elems;
        local_258.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar41 + -0x12);
        local_258.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar41 + -0x10);
        local_258.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar41 + -0xe);
        local_258.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar41 + -0xc);
        local_258.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar41 + -10);
        local_258.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar41 + -8);
        local_258.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar41 + -6);
        local_258.val.m_backend.exp = piVar41[-4];
        local_258.val.m_backend.neg = *(bool *)(piVar41 + -3);
        local_258.val.m_backend._72_8_ = *(undefined8 *)(piVar41 + -2);
        local_258._80_8_ = *(undefined8 *)piVar41;
        local_498.val.m_backend.data._M_elems._0_8_ = uVar8;
        local_498.val.m_backend.data._M_elems._8_8_ = uVar9;
        local_498.val.m_backend.data._M_elems._16_8_ = uVar10;
        local_498.val.m_backend.data._M_elems._24_8_ = uVar11;
        local_498.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_498.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_498.val.m_backend.data._M_elems._48_8_ = uVar14;
        local_498.val.m_backend.data._M_elems._56_8_ = uVar15;
        local_498.val.m_backend.exp = iVar5;
        local_498.val.m_backend.neg = bVar3;
        local_498.val.m_backend.fpclass = fVar6;
        local_498.val.m_backend.prec_elem = iVar7;
        local_498._80_8_ = uVar31;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_548,compare,&local_498,&local_258);
        if (local_548.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_80,0,(type *)0x0);
        iVar39 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_548,&local_80);
        if (iVar39 < 0) break;
        uVar46 = uVar46 + 1;
        piVar41 = piVar41 + 0x16;
      } while (uVar43 != uVar46);
    }
    if (uVar46 == start) {
      uVar31 = *(undefined8 *)keys[(int)uVar46].val.m_backend.data._M_elems;
      uVar8 = *(undefined8 *)(keys[(int)uVar46].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 4;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 8;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 0xc;
      uVar13 = *(undefined8 *)puVar2;
      uVar14 = *(undefined8 *)(puVar2 + 2);
      iVar5 = keys[(int)uVar46].val.m_backend.exp;
      bVar3 = keys[(int)uVar46].val.m_backend.neg;
      iVar39 = keys[(int)uVar46].idx;
      BVar37 = keys[(int)uVar46].src;
      uVar15 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2);
      uVar16 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4);
      uVar17 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6);
      uVar18 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8);
      uVar19 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10);
      uVar20 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc);
      uVar21 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar46].val.m_backend.data._M_elems =
           *(undefined8 *)(pBVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar46].val.m_backend.data._M_elems + 2) = uVar15;
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      puVar2 = keys[(int)uVar46].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      keys[(int)uVar46].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[(int)uVar46].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar32 = pBVar1->src;
      keys[(int)uVar46].idx = pBVar1->idx;
      keys[(int)uVar46].src = BVar32;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc) = uVar13;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe) = uVar14;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10) = uVar12;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4) = uVar9;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6) = uVar10;
      *(undefined8 *)(pBVar1->val).m_backend.data._M_elems = uVar31;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2) = uVar8;
      (pBVar1->val).m_backend.exp = iVar5;
      (pBVar1->val).m_backend.neg = bVar3;
      fVar6 = keys[(int)uVar46].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar46].val.m_backend.prec_elem;
      iVar7 = (pBVar1->val).m_backend.prec_elem;
      keys[(int)uVar46].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[(int)uVar46].val.m_backend.prec_elem = iVar7;
      (pBVar1->val).m_backend.fpclass = fVar6;
      (pBVar1->val).m_backend.prec_elem = iVar33;
      pBVar1->idx = iVar39;
      pBVar1->src = BVar37;
      uVar46 = uVar46 + 1;
    }
  }
  if ((int)(uVar43 - uVar46) < (int)(uVar38 - start)) {
    bVar3 = (int)uVar43 <= (int)uVar46;
    uVar44 = uVar38;
    uVar38 = uVar43;
    uVar43 = uVar46;
    uVar46 = start;
    if (bVar3) goto LAB_00499933;
  }
  else {
    bVar3 = (int)uVar38 <= start;
    uVar44 = uVar43;
    uVar43 = start;
    start = uVar46;
    if (bVar3) goto LAB_00499933;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
            (keys,uVar38 + 1,compare,uVar43,(bool)(~type & 1));
  start = uVar46;
LAB_00499933:
  uVar43 = uVar44;
  type = (bool)(type ^ 1);
  uVar38 = uVar43 - start;
  if ((int)uVar38 < 0x19) goto LAB_00499954;
  goto LAB_00498c53;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}